

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::PrepareFramebufferAuxiliary<3u>
          (StorageMultisampleTest *this,GLenum internal_format)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLuint GVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  undefined4 *puVar10;
  uint local_24;
  GLuint i;
  Functions *gl;
  GLenum internal_format_local;
  StorageMultisampleTest *this_local;
  long lVar9;
  
  pRVar8 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar8->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar9 + 0x6d0))(1,&this->m_fbo_aux);
  dVar3 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar3,"glGenFramebuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xe83);
  (**(code **)(lVar9 + 0x6f8))(1,&this->m_to_aux);
  dVar3 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar3,"glGenRenderbuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xe86);
  (**(code **)(lVar9 + 0x78))(0x8d40,this->m_fbo_aux);
  dVar3 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar3,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xe89);
  (**(code **)(lVar9 + 0xb8))(0x8c1a,this->m_to_aux);
  dVar3 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar3,"glBindRenderbuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xe8c);
  pcVar1 = *(code **)(lVar9 + 0x1468);
  GVar7 = this->m_to_aux;
  GVar4 = TestReferenceDataWidth<3u>();
  GVar5 = TestReferenceDataHeight<3u>();
  GVar6 = TestReferenceDataDepth<3u>();
  (*pcVar1)(GVar7,1,internal_format,GVar4,GVar5,GVar6);
  dVar3 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar3,"glTextureStorage3D call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xe90);
  (**(code **)(lVar9 + 0x1360))(0x8c1a,0x2800,0x2600);
  (**(code **)(lVar9 + 0x1360))(0x8c1a,0x2801,0x2600);
  dVar3 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar3,"glTexParameteri call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xe95);
  local_24 = 0;
  while( true ) {
    GVar7 = TestReferenceDataDepth<3u>();
    if (GVar7 <= local_24) break;
    (**(code **)(lVar9 + 0x6b8))(0x8d40,local_24 + 0x8ce0,this->m_to_aux,0,local_24);
    dVar3 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar3,"glFramebufferRenderbuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0xe9a);
    local_24 = local_24 + 1;
  }
  iVar2 = (**(code **)(lVar9 + 0x170))(0x8d40);
  if (iVar2 != 0x8cd5) {
    puVar10 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar10 = 0;
    __cxa_throw(puVar10,&int::typeinfo,0);
  }
  pcVar1 = *(code **)(lVar9 + 0x1a00);
  GVar7 = TestReferenceDataWidth<3u>();
  GVar4 = TestReferenceDataHeight<3u>();
  (*pcVar1)(0,0,GVar7,GVar4);
  dVar3 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar3,"glViewport call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xea3);
  (**(code **)(lVar9 + 0x1c0))(0,0,0);
  dVar3 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar3,"glClearColor call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xea7);
  (**(code **)(lVar9 + 0x188))(0x4000);
  dVar3 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar3,"glClear call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xeaa);
  return;
}

Assistant:

void StorageMultisampleTest::PrepareFramebufferAuxiliary<3>(const glw::GLenum internal_format)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare framebuffer. */
	gl.genFramebuffers(1, &m_fbo_aux);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers call failed.");

	gl.genTextures(1, &m_to_aux);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_aux);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_to_aux);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer call failed.");

	gl.textureStorage3D(m_to_aux, 1, internal_format, TestReferenceDataWidth<3>(), TestReferenceDataHeight<3>(),
						TestReferenceDataDepth<3>());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureStorage3D call failed.");

	/* Parameter setup. */
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri call failed.");

	for (glw::GLuint i = 0; i < TestReferenceDataDepth<3>(); ++i)
	{
		gl.framebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, m_to_aux, 0, i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer call failed.");
	}

	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
	{
		throw 0;
	}

	gl.viewport(0, 0, TestReferenceDataWidth<3>(), TestReferenceDataHeight<3>());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport call failed.");

	/* Clear framebuffer's content. */
	gl.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor call failed.");

	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClear call failed.");
}